

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

void __thiscall
slang::parsing::Token::Token
          (Token *this,BumpAllocator *alloc,TokenKind kind,
          span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia,string_view rawText,
          SourceLocation location,double value,bool outOfRange,optional<slang::TimeUnit> timeUnit)

{
  bool bVar1;
  double *pdVar2;
  TimeUnit *pTVar3;
  bool outOfRange_local;
  double value_local;
  TokenKind kind_local;
  BumpAllocator *alloc_local;
  Token *this_local;
  SourceLocation SStack_20;
  optional<slang::TimeUnit> timeUnit_local;
  SourceLocation location_local;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia_local;
  
  this_local._6_2_ =
       (_Optional_payload_base<slang::TimeUnit>)
       timeUnit.super__Optional_base<slang::TimeUnit,_true,_true>._M_payload.
       super__Optional_payload_base<slang::TimeUnit>;
  SStack_20 = location;
  NumericTokenFlags::NumericTokenFlags(&this->numFlags);
  this->rawLen = 0;
  this->info = (Info *)0x0;
  if ((kind != RealLiteral) && (kind != TimeLiteral)) {
    assert::assertFailed
              ("kind == TokenKind::RealLiteral || kind == TokenKind::TimeLiteral",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/parsing/Token.cpp"
               ,0xea,
               "slang::parsing::Token::Token(BumpAllocator &, TokenKind, span<const Trivia>, string_view, SourceLocation, double, bool, std::optional<TimeUnit>)"
              );
  }
  init(this,(EVP_PKEY_CTX *)alloc);
  pdVar2 = Info::real(this->info);
  *pdVar2 = value;
  NumericTokenFlags::setOutOfRange(&this->numFlags,outOfRange);
  bVar1 = std::optional::operator_cast_to_bool((optional *)((long)&this_local + 6));
  if (bVar1) {
    pTVar3 = std::optional<slang::TimeUnit>::operator*
                       ((optional<slang::TimeUnit> *)((long)&this_local + 6));
    NumericTokenFlags::set(&this->numFlags,*pTVar3);
  }
  return;
}

Assistant:

Token::Token(BumpAllocator& alloc, TokenKind kind, span<Trivia const> trivia, string_view rawText,
             SourceLocation location, double value, bool outOfRange,
             std::optional<TimeUnit> timeUnit) {
    ASSERT(kind == TokenKind::RealLiteral || kind == TokenKind::TimeLiteral);
    init(alloc, kind, trivia, rawText, location);
    info->real() = value;

    numFlags.setOutOfRange(outOfRange);
    if (timeUnit)
        numFlags.set(*timeUnit);
}